

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDALine.h
# Opt level: O3

void __thiscall
TRM::line_bresenham_interpolator::line_bresenham_interpolator
          (line_bresenham_interpolator *this,int x1,int y1,int x2,int y2)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  this->m_x1_lr = x1 >> 8;
  this->m_y1_lr = y1 >> 8;
  this->m_x2_lr = x2 >> 8;
  uVar5 = (x2 >> 8) - (x1 >> 8);
  uVar2 = -uVar5;
  if (0 < (int)uVar5) {
    uVar2 = uVar5;
  }
  this->m_y2_lr = y2 >> 8;
  uVar6 = (y2 >> 8) - (y1 >> 8);
  uVar5 = -uVar6;
  if (0 < (int)uVar6) {
    uVar5 = uVar6;
  }
  bVar7 = uVar2 < uVar5;
  this->m_ver = bVar7;
  if (uVar5 < uVar2) {
    uVar5 = uVar2;
  }
  this->m_len = uVar5;
  bVar1 = x1 < x2;
  if (bVar7) {
    bVar1 = y1 < y2;
  }
  if (bVar7) {
    y2 = x2;
    y1 = x1;
  }
  iVar4 = uVar5 + (uVar5 == 0);
  this->m_inc = (uint)bVar1 * 2 + -1;
  (this->m_interpolator).m_cnt = iVar4;
  iVar3 = (y2 - y1) / iVar4;
  iVar4 = (y2 - y1) % iVar4;
  (this->m_interpolator).m_lft = iVar3;
  (this->m_interpolator).m_rem = iVar4;
  (this->m_interpolator).m_y = y1;
  if (iVar4 < 1) {
    iVar4 = iVar4 + uVar5;
    (this->m_interpolator).m_rem = iVar4;
    (this->m_interpolator).m_lft = iVar3 + -1;
  }
  (this->m_interpolator).m_mod = iVar4 - uVar5;
  return;
}

Assistant:

explicit line_bresenham_interpolator(int x1, int y1, int x2, int y2)
      : m_x1_lr(line_lr(x1)),
        m_y1_lr(line_lr(y1)),
        m_x2_lr(line_lr(x2)),
        m_y2_lr(line_lr(y2)),
        m_ver(std::abs(m_x2_lr - m_x1_lr) < std::abs(m_y2_lr - m_y1_lr)),
        m_len(m_ver ? std::abs(m_y2_lr - m_y1_lr)
                    : std::abs(m_x2_lr - m_x1_lr)),
        m_inc(m_ver ? ((y2 > y1) ? 1 : -1) : ((x2 > x1) ? 1 : -1)),
        m_interpolator(m_ver ? x1 : y1, m_ver ? x2 : y2, m_len) {}